

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall capnp::compiler::NodeTranslator::StructLayout::Group::addMember(Group *this)

{
  Group *this_local;
  
  if ((this->hasMembers & 1U) == 0) {
    this->hasMembers = true;
    Union::newGroupAddingFirstMember(this->parent);
  }
  return;
}

Assistant:

void addMember() {
      if (!hasMembers) {
        hasMembers = true;
        parent.newGroupAddingFirstMember();
      }
    }